

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setDataLocations(GLShaderProgram *this)

{
  pointer pGVar1;
  pointer pGVar2;
  pointer pGVar3;
  GLint GVar4;
  runtime_error *prVar5;
  pointer __rhs;
  pointer __rhs_00;
  pointer __rhs_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  (*glad_glUseProgram)(this->programHandle);
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs = (this->uniforms).
               super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
               ._M_impl.super__Vector_impl_data._M_start; __rhs != pGVar1; __rhs = __rhs + 1) {
    GVar4 = (*glad_glGetUniformLocation)(this->programHandle,(__rhs->name)._M_dataplus._M_p);
    __rhs->location = GVar4;
    if (GVar4 == -1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_48,"failed to get location for uniform ",&__rhs->name);
      std::runtime_error::runtime_error(prVar5,(string *)&bStack_48);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pGVar2 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs_00 = (this->attributes).
                  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start; __rhs_00 != pGVar2;
      __rhs_00 = __rhs_00 + 1) {
    GVar4 = (*glad_glGetAttribLocation)(this->programHandle,(__rhs_00->name)._M_dataplus._M_p);
    __rhs_00->location = GVar4;
    if (GVar4 == -1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_48,"failed to get location for attribute ",&__rhs_00->name);
      std::runtime_error::runtime_error(prVar5,(string *)&bStack_48);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __rhs_01 = (this->textures).
             super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__rhs_01 == pGVar3) {
      checkGLError(true);
      return;
    }
    GVar4 = (*glad_glGetUniformLocation)(this->programHandle,(__rhs_01->name)._M_dataplus._M_p);
    __rhs_01->location = GVar4;
    if (GVar4 == -1) break;
    __rhs_01 = __rhs_01 + 1;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,"failed to get location for texture ",&__rhs_01->name);
  std::runtime_error::runtime_error(prVar5,(string *)&bStack_48);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLShaderProgram::setDataLocations() {
  glUseProgram(programHandle);

  // Uniforms
  for (GLShaderUniform& u : uniforms) {
    u.location = glGetUniformLocation(programHandle, u.name.c_str());
    if (u.location == -1) throw std::runtime_error("failed to get location for uniform " + u.name);
  }

  // Attributes
  for (GLShaderAttribute& a : attributes) {
    a.location = glGetAttribLocation(programHandle, a.name.c_str());
    if (a.location == -1) throw std::runtime_error("failed to get location for attribute " + a.name);
  }

  // Textures
  for (GLShaderTexture& t : textures) {
    t.location = glGetUniformLocation(programHandle, t.name.c_str());
    if (t.location == -1) throw std::runtime_error("failed to get location for texture " + t.name);
  }

  checkGLError();
}